

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS
ref_egads_eval_at(REF_GEOM ref_geom,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *xyz,
                 REF_DBL *dxyz_dtuv)

{
  int local_34;
  REF_INT i;
  REF_DBL *dxyz_dtuv_local;
  REF_DBL *xyz_local;
  REF_DBL *params_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_GEOM ref_geom_local;
  
  printf("evaluating to (0,0,0), No EGADS linked for %s\n","ref_egads_eval_at");
  printf("type %d id %d\n",(ulong)(uint)type,(ulong)(uint)id);
  *xyz = 0.0;
  xyz[1] = 0.0;
  xyz[2] = 0.0;
  if (dxyz_dtuv != (REF_DBL *)0x0) {
    for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
      dxyz_dtuv[local_34] = 0.0;
    }
    if (type == 2) {
      for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
        dxyz_dtuv[local_34 + 6] = 0.0;
      }
    }
  }
  return 6;
}

Assistant:

REF_FCN REF_STATUS ref_egads_eval_at(REF_GEOM ref_geom, REF_INT type,
                                     REF_INT id, REF_DBL *params, REF_DBL *xyz,
                                     REF_DBL *dxyz_dtuv) {
#ifdef HAVE_EGADS
  double eval[18];
  REF_INT i;
  ego *nodes, *edges, *faces;
  ego object;
  int status;

  if (NULL != ref_geom_facelift(ref_geom)) {
    RSS(ref_facelift_eval_at(ref_geom_facelift(ref_geom), type, id, params, xyz,
                             dxyz_dtuv),
        "facelift eval wrapper");
    return REF_SUCCESS;
  }

  object = (ego)NULL;
  switch (type) {
    case (REF_GEOM_NODE):
      RNS(ref_geom->nodes, "nodes not loaded");
      if (id < 1 || id > ref_geom->nnode) return REF_INVALID;
      nodes = (ego *)(ref_geom->nodes);
      object = nodes[id - 1];
      {
        ego ref, *pchldrn;
        int oclass, mtype, nchild, *psens;
        REIS(EGADS_SUCCESS,
             EG_getTopology(object, &ref, &oclass, &mtype, xyz, &nchild,
                            &pchldrn, &psens),
             "EG topo node");
      }
      return REF_SUCCESS;
    case (REF_GEOM_EDGE):
      RNS(ref_geom->edges, "edges not loaded");
      if (id < 1 || id > ref_geom->nedge) return REF_INVALID;
      edges = (ego *)(ref_geom->edges);
      object = edges[id - 1];
      break;
    case (REF_GEOM_FACE):
      RNS(ref_geom->faces, "faces not loaded");
      if (id < 1 || id > ref_geom->nface) return REF_INVALID;
      faces = (ego *)(ref_geom->faces);
      object = faces[id - 1];
      break;
    default:
      RSS(REF_IMPLEMENT, "unknown geom");
  }

  status = EG_evaluate(object, params, eval);
  if (EGADS_SUCCESS != status) {
    ego ref, *pchldrn;
    int oclass, mtype, nchild, *psens;
    double range[4] = {-999, -999, -999, -999};
    printf(" %d EG_getTopology\n",
           EG_getTopology(object, &ref, &oclass, &mtype, range, &nchild,
                          &pchldrn, &psens));
    printf("range %f %f %f %f\n", range[0], range[1], range[2], range[3]);
    printf("type %d id %d\n", type, id);
    if (type > 0) printf("param[0] = %f\n", params[0]);
    if (type > 1) printf("param[1] = %f\n", params[1]);
    REIS(EGADS_SUCCESS, status, "eval");
  }
  xyz[0] = eval[0];
  xyz[1] = eval[1];
  xyz[2] = eval[2];
  if (NULL != dxyz_dtuv) {
    for (i = 0; i < 6; i++) dxyz_dtuv[i] = eval[3 + i];
    if (REF_GEOM_FACE == type)
      for (i = 0; i < 9; i++) dxyz_dtuv[6 + i] = eval[9 + i];
  }
  return REF_SUCCESS;
#else
  REF_INT i;
  printf("evaluating to (0,0,0), No EGADS linked for %s\n", __func__);
  printf("type %d id %d\n", type, id);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(params);
  xyz[0] = 0.0;
  xyz[1] = 0.0;
  xyz[2] = 0.0;
  if (NULL != dxyz_dtuv) {
    for (i = 0; i < 6; i++) {
      dxyz_dtuv[i] = 0.0;
    }
    if (REF_GEOM_FACE == type) {
      for (i = 0; i < 9; i++) dxyz_dtuv[6 + i] = 0.0;
    }
  }
  return REF_IMPLEMENT;
#endif
}